

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O3

NewOrderSingle *
anon_unknown.dwarf_52c65e::createNewOrderSingle
          (NewOrderSingle *__return_storage_ptr__,char *sender,char *target,int seq)

{
  undefined1 *this;
  int iVar1;
  NewOrderSingle *extraout_RAX;
  long *local_280;
  long local_278;
  long local_270 [2];
  long *local_260;
  long local_258;
  long local_250 [2];
  undefined1 local_240 [16];
  _Alloc_hider local_230;
  char local_220 [16];
  _Alloc_hider local_210;
  size_type local_208;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_200;
  field_metrics local_1f0;
  undefined1 local_1e8 [16];
  _Alloc_hider local_1d8;
  char local_1c8 [16];
  _Alloc_hider local_1b8;
  size_type local_1b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  field_metrics local_198;
  FieldBase local_190;
  FieldBase local_138;
  FieldBase local_e0;
  FieldBase local_88;
  
  local_280 = local_270;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_280,"ID","");
  local_240._0_8_ = &PTR__FieldBase_00320f80;
  local_240._8_4_ = 0xb;
  local_230._M_p = local_220;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_230,local_280,local_278 + (long)local_280);
  local_210._M_p = (pointer)&local_200;
  local_208 = 0;
  local_200._M_local_buf[0] = '\0';
  local_1f0.m_length = 0;
  local_1f0.m_checksum = 0;
  local_240._0_8_ = &PTR__FieldBase_00326df8;
  FIX::CharField::CharField((CharField *)&local_138,0x15,'1');
  local_138._vptr_FieldBase = (_func_int **)&PTR__FieldBase_003279a8;
  local_260 = local_250;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"SYMBOL","");
  local_1e8._0_8_ = &PTR__FieldBase_00320f80;
  local_1e8._8_4_ = 0x37;
  local_1d8._M_p = local_1c8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1d8,local_260,local_258 + (long)local_260);
  local_1b8._M_p = (pointer)&local_1a8;
  local_1b0 = 0;
  local_1a8._M_local_buf[0] = '\0';
  local_198.m_length = 0;
  local_198.m_checksum = 0;
  local_1e8._0_8_ = &PTR__FieldBase_00324f68;
  FIX::CharField::CharField((CharField *)&local_190,0x36,'1');
  local_190._vptr_FieldBase = (_func_int **)&PTR__FieldBase_00327310;
  FIX::TransactTime::now();
  FIX::CharField::CharField((CharField *)&local_e0,0x28,'1');
  local_e0._vptr_FieldBase = (_func_int **)&PTR__FieldBase_003250b8;
  FIX42::NewOrderSingle::NewOrderSingle
            (__return_storage_ptr__,(ClOrdID *)local_240,(HandlInst *)&local_138,(Symbol *)local_1e8
             ,(Side *)&local_190,(TransactTime *)&local_88,(OrdType *)&local_e0);
  FIX::FieldBase::~FieldBase(&local_e0);
  FIX::FieldBase::~FieldBase(&local_88);
  FIX::FieldBase::~FieldBase(&local_190);
  FIX::FieldBase::~FieldBase((FieldBase *)local_1e8);
  if (local_260 != local_250) {
    operator_delete(local_260,local_250[0] + 1);
  }
  FIX::FieldBase::~FieldBase(&local_138);
  FIX::FieldBase::~FieldBase((FieldBase *)local_240);
  if (local_280 != local_270) {
    operator_delete(local_280,local_270[0] + 1);
  }
  this = &(__return_storage_ptr__->super_Message).field_0x70;
  fillHeader((Header *)this,sender,target,seq);
  iVar1 = FIX::Message::bodyLength((Message *)__return_storage_ptr__,8,9,10);
  FIX::IntField::IntField((IntField *)local_240,9,iVar1);
  local_240._0_8_ = &PTR__FieldBase_003253c8;
  FIX::FieldMap::setField((FieldMap *)this,(FieldBase *)local_240,true);
  FIX::FieldBase::~FieldBase((FieldBase *)local_240);
  iVar1 = FIX::Message::checkSum((Message *)__return_storage_ptr__,10);
  FIX::CheckSumField::CheckSumField((CheckSumField *)local_240,10,iVar1);
  local_240._0_8_ = &PTR__FieldBase_00325560;
  FIX::FieldMap::setField
            ((FieldMap *)&(__return_storage_ptr__->super_Message).field_0xe0,(FieldBase *)local_240,
             true);
  FIX::FieldBase::~FieldBase((FieldBase *)local_240);
  return extraout_RAX;
}

Assistant:

FIX42::NewOrderSingle createNewOrderSingle(const char *sender, const char *target, int seq) {
  FIX42::NewOrderSingle newOrderSingle(
      ClOrdID("ID"),
      HandlInst('1'),
      Symbol("SYMBOL"),
      Side(Side_BUY),
      TransactTime::now(),
      OrdType(OrdType_MARKET));
  fillHeader(newOrderSingle.getHeader(), sender, target, seq);
  newOrderSingle.getHeader().setField(BodyLength(newOrderSingle.bodyLength()));
  newOrderSingle.getTrailer().setField(CheckSum(newOrderSingle.checkSum()));
  return newOrderSingle;
}